

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_describe_server_certificate(void)

{
  code *pcVar1;
  char *__s;
  SlbDescribeServerCertificateRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_229;
  int ret;
  HttpTestListener *local_208;
  HttpTestListener *listener;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [55];
  allocator<char> local_171;
  string local_170 [32];
  SlbDescribeServerCertificateRequestType *local_150;
  Slb *slb;
  SlbDescribeServerCertificateResponseType resp;
  SlbDescribeServerCertificateRequestType req;
  
  aliyun::SlbDescribeServerCertificateRequestType::SlbDescribeServerCertificateRequestType
            ((SlbDescribeServerCertificateRequestType *)
             ((long)&resp.server_certificate_name.field_2 + 8));
  aliyun::SlbDescribeServerCertificateResponseType::SlbDescribeServerCertificateResponseType
            ((SlbDescribeServerCertificateResponseType *)&slb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"cn-hangzhou",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"my_appid",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"my_secret",&local_1d1);
  pSVar2 = (SlbDescribeServerCertificateRequestType *)
           aliyun::Slb::CreateSlbClient(local_170,local_1a8,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_150 = pSVar2;
  if (pSVar2 == (SlbDescribeServerCertificateRequestType *)0x0) {
    aliyun::SlbDescribeServerCertificateResponseType::~SlbDescribeServerCertificateResponseType
              ((SlbDescribeServerCertificateResponseType *)&slb);
    aliyun::SlbDescribeServerCertificateRequestType::~SlbDescribeServerCertificateRequestType
              ((SlbDescribeServerCertificateRequestType *)
               ((long)&resp.server_certificate_name.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_150,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_server_certificate_response;
  local_208 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_229);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_229);
  HttpTestListener::Start(local_208);
  std::__cxx11::string::operator=
            ((string *)(resp.server_certificate_name.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"ServerCertificateId");
  std::__cxx11::string::operator=
            ((string *)(req.server_certificate_id.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::DescribeServerCertificate
            (local_150,
             (SlbDescribeServerCertificateResponseType *)
             ((long)&resp.server_certificate_name.field_2 + 8),(SlbErrorInfo *)&slb);
  HttpTestListener::WaitComplete(local_208);
  pHVar3 = local_208;
  if (local_208 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_208);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_150;
  if (local_150 != (SlbDescribeServerCertificateRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_150);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_server_certificate() {
  SlbDescribeServerCertificateRequestType req;
  SlbDescribeServerCertificateResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_server_certificate_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.server_certificate_id = "ServerCertificateId";
  req.owner_account = "OwnerAccount";
  int ret = slb->DescribeServerCertificate(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}